

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O0

void __thiscall
absl::lts_20240722::str_format_internal::FormatSinkImpl::Append(FormatSinkImpl *this,string_view v)

{
  char *__dest;
  string_view s;
  size_type __n;
  size_t sVar1;
  const_pointer __src;
  size_t n;
  FormatSinkImpl *this_local;
  string_view v_local;
  
  v_local._M_len = (size_t)v._M_str;
  this_local = (FormatSinkImpl *)v._M_len;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (__n != 0) {
    this->size_ = __n + this->size_;
    sVar1 = Avail(this);
    if (__n < sVar1) {
      __dest = this->pos_;
      __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      memcpy(__dest,__src,__n);
      this->pos_ = this->pos_ + __n;
    }
    else {
      Flush(this);
      s._M_str = (char *)v_local._M_len;
      s._M_len = (size_t)this_local;
      FormatRawSinkImpl::Write(&this->raw_,s);
    }
  }
  return;
}

Assistant:

void Append(string_view v) {
    size_t n = v.size();
    if (n == 0) return;
    size_ += n;
    if (n >= Avail()) {
      Flush();
      raw_.Write(v);
      return;
    }
    memcpy(pos_, v.data(), n);
    pos_ += n;
  }